

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O1

void __thiscall
de::ArrayBuffer<int,_4UL,_4UL>::setStorage(ArrayBuffer<int,_4UL,_4UL> *this,size_t numElements)

{
  void *ptr;
  void *otherPtr;
  void *pvVar1;
  size_t otherCap;
  
  if (numElements == 0) {
    pvVar1 = (void *)0x0;
    numElements = 0;
  }
  else {
    pvVar1 = detail::ArrayBuffer_AlignedMalloc(numElements * 4,4);
  }
  ptr = this->m_ptr;
  this->m_ptr = pvVar1;
  this->m_cap = numElements;
  deAlignedFree(ptr);
  return;
}

Assistant:

void ArrayBuffer<T,Alignment,Stride>::setStorage (size_t numElements)
{
	// create new buffer of the wanted size, swap to it
	ArrayBuffer<T,Alignment,Stride> newBuffer(numElements);
	swap(newBuffer);
}